

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* soul::HTMLGenerator::groupMarkdownIntoParagraphs
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *lines)

{
  pointer pbVar1;
  bool bVar2;
  pointer pbVar3;
  ulong uVar4;
  pointer __lhs;
  string_view s;
  string_view s_00;
  string_view t;
  string_view t_00;
  ulong local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string trimmedLine;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  trimmedLine._M_dataplus._M_p = (pointer)&trimmedLine.field_2;
  trimmedLine._M_string_length = 0;
  trimmedLine.field_2._M_local_buf[0] = '\0';
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&trimmedLine);
  std::__cxx11::string::~string((string *)&trimmedLine);
  __lhs = (lines->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (lines->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_98 = 0;
  bVar2 = false;
  do {
    if (__lhs == pbVar1) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&local_50,(string *)__lhs);
    choc::text::trim(&trimmedLine,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    uVar4 = __lhs->_M_string_length - trimmedLine._M_string_length;
    if (bVar2) {
      s._M_str = "```";
      s._M_len = 3;
      t._M_str = trimmedLine._M_dataplus._M_p;
      t._M_len = trimmedLine._M_string_length;
      bVar2 = choc::text::startsWith(t,s);
      if (bVar2) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        local_90._M_string_length = 0;
        local_90.field_2._M_local_buf[0] = '\0';
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        if ((local_98 <= uVar4) || (trimmedLine._M_string_length == 0)) {
          std::operator+(&local_90,__lhs,'\n');
          std::__cxx11::string::append
                    ((string *)
                     ((__return_storage_ptr__->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish + -1));
          std::__cxx11::string::~string((string *)&local_90);
          bVar2 = true;
          goto LAB_00266e1d;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,__lhs);
      }
      local_98 = 0;
LAB_00266e1b:
      bVar2 = false;
    }
    else {
      if (trimmedLine._M_string_length == 0) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        local_90._M_string_length = 0;
        local_90.field_2._M_local_buf[0] = '\0';
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        goto LAB_00266e1b;
      }
      bVar2 = isListMarker(&trimmedLine);
      if (bVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,__lhs);
        goto LAB_00266e1b;
      }
      s_00._M_str = "```";
      s_00._M_len = 3;
      t_00._M_str = trimmedLine._M_dataplus._M_p;
      t_00._M_len = trimmedLine._M_string_length;
      bVar2 = choc::text::startsWith(t_00,s_00);
      if (bVar2) {
        std::operator+(&local_90,&trimmedLine,'\n');
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        bVar2 = true;
        local_98 = 0;
      }
      else {
        if ((uVar4 < 4) ||
           ((__return_storage_ptr__->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length != 0)) {
          if (trimmedLine._M_string_length != 0) {
            pbVar3 = (__return_storage_ptr__->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            if ((pbVar3[-1]._M_string_length != 0) && (*(__lhs->_M_dataplus)._M_p != ' ')) {
              std::__cxx11::string::push_back((char)pbVar3 + -0x20);
              pbVar3 = (__return_storage_ptr__->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            }
            std::__cxx11::string::append((string *)(pbVar3 + -1));
          }
          goto LAB_00266e1b;
        }
        std::operator+(&local_90,__lhs,'\n');
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        bVar2 = true;
        local_98 = uVar4;
      }
    }
LAB_00266e1d:
    std::__cxx11::string::~string((string *)&trimmedLine);
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

static std::vector<std::string> groupMarkdownIntoParagraphs (const std::vector<std::string>& lines)
    {
        std::vector<std::string> paragraphs;
        paragraphs.push_back ({});
        bool isInCodeSection = false;
        size_t codeSectionIndent = 0;

        for (auto& line : lines)
        {
            auto trimmedLine = choc::text::trim (line);
            auto leadingSpaces = line.length() - trimmedLine.length();

            if (isInCodeSection)
            {
                if (choc::text::startsWith (trimmedLine, "```"))
                {
                    isInCodeSection = false;
                    codeSectionIndent = 0;
                    paragraphs.push_back ({});
                    continue;
                }

                if (leadingSpaces >= codeSectionIndent || trimmedLine.empty())
                {
                    paragraphs.back() += line + '\n';
                    continue;
                }

                isInCodeSection = false;
                codeSectionIndent = 0;
                paragraphs.push_back (line);
                continue;
            }

            if (trimmedLine.empty())
            {
                paragraphs.push_back ({});
            }
            else if (isListMarker (trimmedLine))
            {
                paragraphs.push_back (line);
            }
            else if (choc::text::startsWith (trimmedLine, "```"))
            {
                isInCodeSection = true;
                codeSectionIndent = 0;
                paragraphs.push_back (trimmedLine + '\n');
            }
            else if (leadingSpaces >= 4 && paragraphs.back().empty())
            {
                isInCodeSection = true;
                codeSectionIndent = leadingSpaces;
                paragraphs.push_back (line + '\n');
            }
            else if (! trimmedLine.empty())
            {
                if (! (paragraphs.back().empty() || line.front() == ' '))
                    paragraphs.back() += ' ';

                paragraphs.back() += line;
            }
        }

        return paragraphs;
    }